

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

void spvtools::opt::anon_unknown_0::CreateDecoration
               (DecorationManager *decoration_mgr,uint32_t var_id,Decoration decoration,
               uint32_t literal)

{
  long lVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_174;
  Decoration local_170;
  uint32_t local_16c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_d8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  init_list._M_len = 1;
  init_list._M_array = &local_16c;
  local_16c = var_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
  local_c0._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_170;
  local_170 = decoration;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
  local_90 = 0x1c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_174;
  local_174 = literal;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
  local_60 = 6;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&operands,
             local_c0,&stack0xffffffffffffffd0);
  lVar1 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  local_d8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start =
       operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_d8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  analysis::DecorationManager::AddDecoration(decoration_mgr,OpDecorate,&local_d8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_d8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return;
}

Assistant:

void CreateDecoration(analysis::DecorationManager* decoration_mgr,
                      uint32_t var_id, spv::Decoration decoration,
                      uint32_t literal) {
  std::vector<Operand> operands({
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {var_id}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_DECORATION,
       {static_cast<uint32_t>(decoration)}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_LITERAL_INTEGER, {literal}},
  });
  decoration_mgr->AddDecoration(spv::Op::OpDecorate, std::move(operands));
}